

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argsman_tests.cpp
# Opt level: O1

void argsman_tests::TestParse(string *str,bool expected_bool,int64_t expected_int)

{
  long lVar1;
  bool bVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  long in_FS_OFFSET;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  check_type cVar5;
  undefined1 *local_458;
  undefined1 *local_450;
  char *local_448;
  char *local_440;
  int64_t local_438;
  undefined1 *local_430;
  undefined1 *local_428;
  char *local_420;
  char *local_418;
  undefined1 *local_410;
  undefined1 *local_408;
  char *local_400;
  char *local_3f8;
  undefined1 local_3f0 [16];
  undefined1 *local_3e0;
  char *local_3d8;
  undefined1 *local_3d0;
  undefined1 *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  undefined1 *local_3a0;
  undefined1 *local_398;
  char *local_390;
  char *local_388;
  int64_t expected_int_local;
  bool expected_bool_local;
  bool *local_370;
  assertion_result local_368;
  bool **local_350;
  int64_t *local_348;
  char *local_340;
  char *local_338;
  assertion_result local_330;
  string local_318;
  string error;
  char *argv [2];
  string arg;
  undefined1 local_2a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  uint local_288;
  TestArgsManager test;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  expected_int_local = expected_int;
  expected_bool_local = expected_bool;
  ArgsManager::ArgsManager(&test.super_ArgsManager);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&test.super_ArgsManager.m_network_only_args._M_t);
  local_2a8._0_8_ = &local_298;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"-value","");
  local_288 = 1;
  __l._M_len = 1;
  __l._M_array = (iterator)local_2a8;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            *)&local_368,__l,(allocator_type *)&arg);
  TestArgsManager::SetupArgs
            (&test,(vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    *)&local_368);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)&local_368);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._0_8_ != &local_298) {
    operator_delete((void *)local_2a8._0_8_,(ulong)(local_298._M_allocated_capacity + 1));
  }
  std::operator+(&arg,"-value=",str);
  argv[0] = "ignored";
  argv[1] = arg._M_dataplus._M_p;
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error._M_string_length = 0;
  error.field_2._M_local_buf[0] = '\0';
  local_390 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_388 = "";
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x112;
  file.m_begin = (iterator)&local_390;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_3a0,msg);
  _cVar5 = 0x26a359;
  bVar2 = ArgsManager::ParseParameters(&test.super_ArgsManager,2,argv,&error);
  local_368.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar2;
  local_368.m_message.px = (element_type *)0x0;
  local_368.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_298._8_8_ = local_3f0;
  local_3f0._0_8_ = "test.ParseParameters(2, argv, error)";
  local_3f0._8_8_ = "";
  local_2a8[8] = false;
  local_2a8._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_298._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_3b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_3a8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_368,(lazy_ostream *)local_2a8,1,0,WARN,_cVar5,(size_t)&local_3b0,0x112);
  boost::detail::shared_count::~shared_count(&local_368.m_message.pn);
  local_3c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_3b8 = "";
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x113;
  file_00.m_begin = (iterator)&local_3c0;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_3d0,
             msg_00);
  local_3f0._8_8_ = local_3f0._8_8_ & 0xffffffffffffff00;
  local_3f0._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_3e0 = boost::unit_test::lazy_ostream::inst;
  local_3d8 = "";
  local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"-value","");
  bVar2 = ArgsManager::GetBoolArg(&test.super_ArgsManager,&local_318,false);
  local_348 = &local_438;
  local_330.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(expected_bool_local == bVar2);
  local_438 = CONCAT71(local_438._1_7_,bVar2);
  local_330.m_message.px = (element_type *)0x0;
  local_330.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_340 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_338 = "";
  local_298._8_8_ = &local_348;
  local_2a8[8] = false;
  local_2a8._0_8_ = &PTR__lazy_ostream_013d4010;
  local_298._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_350 = &local_370;
  local_368.m_message.px = (element_type *)((ulong)local_368.m_message.px & 0xffffffffffffff00);
  local_368._0_8_ = &PTR__lazy_ostream_013d4010;
  local_368.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_370 = &expected_bool_local;
  boost::test_tools::tt_detail::report_assertion
            (&local_330,(lazy_ostream *)local_3f0,1,2,REQUIRE,0xe84443,(size_t)&local_340,0x113,
             local_2a8,"expected_bool",&local_368);
  boost::detail::shared_count::~shared_count(&local_330.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  local_400 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_3f8 = "";
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x114;
  file_01.m_begin = (iterator)&local_400;
  msg_01.m_end = pvVar4;
  msg_01.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_410,
             msg_01);
  local_3f0._8_8_ = local_3f0._8_8_ & 0xffffffffffffff00;
  local_3f0._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_3e0 = boost::unit_test::lazy_ostream::inst;
  local_3d8 = "";
  local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"-value","");
  bVar2 = ArgsManager::GetBoolArg(&test.super_ArgsManager,&local_318,true);
  local_438 = CONCAT71(local_438._1_7_,bVar2);
  local_330.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(expected_bool_local == bVar2);
  local_330.m_message.px = (element_type *)0x0;
  local_330.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_340 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_338 = "";
  local_348 = &local_438;
  local_2a8[8] = false;
  local_2a8._0_8_ = &PTR__lazy_ostream_013d4010;
  local_298._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_298._8_8_ = &local_348;
  local_368.m_message.px = (element_type *)((ulong)local_368.m_message.px & 0xffffffffffffff00);
  local_368._0_8_ = &PTR__lazy_ostream_013d4010;
  local_368.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_350 = &local_370;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_370 = &expected_bool_local;
  boost::test_tools::tt_detail::report_assertion
            (&local_330,(lazy_ostream *)local_3f0,1,2,REQUIRE,0xe84464,(size_t)&local_340,0x114,
             local_2a8,"expected_bool",&local_368);
  boost::detail::shared_count::~shared_count(&local_330.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  local_420 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_418 = "";
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x115;
  file_02.m_begin = (iterator)&local_420;
  msg_02.m_end = pvVar4;
  msg_02.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_430,
             msg_02);
  local_3f0._8_8_ = local_3f0._8_8_ & 0xffffffffffffff00;
  local_3f0._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_3e0 = boost::unit_test::lazy_ostream::inst;
  local_3d8 = "";
  local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"-value","");
  local_438 = ArgsManager::GetIntArg(&test.super_ArgsManager,&local_318,0x1869e);
  local_330.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_438 == expected_int_local);
  local_330.m_message.px = (element_type *)0x0;
  local_330.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_340 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_338 = "";
  local_348 = &local_438;
  local_2a8[8] = false;
  local_2a8._0_8_ = &PTR__lazy_ostream_013d4050;
  local_298._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_298._8_8_ = &local_348;
  local_368.m_message.px = (element_type *)((ulong)local_368.m_message.px & 0xffffffffffffff00);
  local_368._0_8_ = &PTR__lazy_ostream_013d4050;
  local_368.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_350 = &local_370;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_370 = (bool *)&expected_int_local;
  boost::test_tools::tt_detail::report_assertion
            (&local_330,(lazy_ostream *)local_3f0,1,2,REQUIRE,0xe8450d,(size_t)&local_340,0x115,
             local_2a8,"expected_int",&local_368);
  boost::detail::shared_count::~shared_count(&local_330.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  local_448 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_440 = "";
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x116;
  file_03.m_begin = (iterator)&local_448;
  msg_03.m_end = pvVar4;
  msg_03.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_458,
             msg_03);
  local_3f0._8_8_ = local_3f0._8_8_ & 0xffffffffffffff00;
  local_3f0._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_3e0 = boost::unit_test::lazy_ostream::inst;
  local_3d8 = "";
  local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"-value","");
  local_438 = ArgsManager::GetIntArg(&test.super_ArgsManager,&local_318,99999);
  local_330.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_438 == expected_int_local);
  local_330.m_message.px = (element_type *)0x0;
  local_330.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_340 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_338 = "";
  local_348 = &local_438;
  local_2a8[8] = false;
  local_2a8._0_8_ = &PTR__lazy_ostream_013d4050;
  local_298._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_298._8_8_ = &local_348;
  local_368.m_message.px = (element_type *)((ulong)local_368.m_message.px & 0xffffffffffffff00);
  local_368._0_8_ = &PTR__lazy_ostream_013d4050;
  local_368.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_350 = &local_370;
  local_370 = (bool *)&expected_int_local;
  boost::test_tools::tt_detail::report_assertion
            (&local_330,(lazy_ostream *)local_3f0,1,2,REQUIRE,0xe84411,(size_t)&local_340,0x116,
             local_2a8,"expected_int",&local_368);
  boost::detail::shared_count::~shared_count(&local_330.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)error._M_dataplus._M_p != &error.field_2) {
    operator_delete(error._M_dataplus._M_p,
                    CONCAT71(error.field_2._M_allocated_capacity._1_7_,error.field_2._M_local_buf[0]
                            ) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)arg._M_dataplus._M_p != &arg.field_2) {
    operator_delete(arg._M_dataplus._M_p,arg.field_2._M_allocated_capacity + 1);
  }
  ArgsManager::~ArgsManager(&test.super_ArgsManager);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void TestParse(const std::string& str, bool expected_bool, int64_t expected_int)
{
    TestArgsManager test;
    test.SetupArgs({{"-value", ArgsManager::ALLOW_ANY}});
    std::string arg = "-value=" + str;
    const char* argv[] = {"ignored", arg.c_str()};
    std::string error;
    BOOST_CHECK(test.ParseParameters(2, argv, error));
    BOOST_CHECK_EQUAL(test.GetBoolArg("-value", false), expected_bool);
    BOOST_CHECK_EQUAL(test.GetBoolArg("-value", true), expected_bool);
    BOOST_CHECK_EQUAL(test.GetIntArg("-value", 99998), expected_int);
    BOOST_CHECK_EQUAL(test.GetIntArg("-value", 99999), expected_int);
}